

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrumTAP.cpp
# Opt level: O3

Pulse __thiscall Storage::Tape::ZXSpectrumTAP::virtual_get_next_pulse(ZXSpectrumTAP *this)

{
  Phase PVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  int iVar7;
  Pulse PVar8;
  uint local_28;
  undefined4 uStack_24;
  
  uVar6 = 0x100000000;
  PVar1 = this->phase_;
  if (PVar1 == Gap) {
    local_28 = 2;
    uStack_24 = 1;
    read_next_block(this);
    uVar4 = 1;
  }
  else {
    uVar4 = this->distance_into_phase_;
    uVar5 = uVar4 & 1;
    local_28 = uVar5 ^ 1;
    if (PVar1 == Data) {
      uVar6 = 0x3567e000000357;
      if ((char)this->data_byte_ < '\0') {
        uVar6 = 0x3567e0000006ae;
      }
      uVar4 = uVar4 + 1;
      this->distance_into_phase_ = uVar4;
      if (uVar5 != 0) {
        this->data_byte_ = this->data_byte_ * '\x02';
      }
      if ((uVar4 & 0xf) == 0) {
        if ((int)uVar4 >> 4 == (uint)this->block_length_) {
          if (this->block_type_ == '\0') {
            read_next_block(this);
          }
          else {
            this->phase_ = Gap;
            this->distance_into_phase_ = 0;
          }
        }
        else {
          uVar2 = FileHolder::get8(&this->file_);
          this->data_byte_ = uVar2;
        }
      }
    }
    else if (PVar1 == PilotTone) {
      iVar3 = uVar4 + 1;
      this->distance_into_phase_ = iVar3;
      iVar7 = 0x1f7f;
      if (this->block_type_ == '\0') {
        iVar7 = 0xc97;
      }
      if (iVar3 < iVar7) {
        uVar6 = 0x6acfc0000010f;
      }
      else {
        uVar6 = 0x3567e0000002df;
        if (uVar5 == 0) {
          uVar6 = 0x3567e00000029b;
        }
        iVar7 = 0x1f80;
        if (this->block_type_ == '\0') {
          iVar7 = 0xc98;
        }
        if (iVar3 == iVar7) {
          this->phase_ = Data;
          this->distance_into_phase_ = 0;
        }
      }
    }
    uStack_24 = (undefined4)uVar6;
    uVar4 = (uint)((ulong)uVar6 >> 0x20);
  }
  PVar8.length.length = uStack_24;
  PVar8.type = local_28;
  PVar8.length.clock_rate = uVar4;
  return PVar8;
}

Assistant:

Tape::Pulse ZXSpectrumTAP::virtual_get_next_pulse() {
	// Adopt a general pattern of high then low.
	Pulse pulse;
	pulse.type = (distance_into_phase_ & 1) ? Pulse::Type::High : Pulse::Type::Low;

	switch(phase_) {
		default: break;

		case Phase::PilotTone: {
			// Output: pulses of length 2168;
			// 8063 pulses if block type is 0, otherwise 3223;
			// then a 667-length pulse followed by a 735-length pulse.

			pulse.length = Time(271, 437'500);	// i.e. 2168 / 3'500'000
			++distance_into_phase_;

			// Check whether in the last two.
			if(distance_into_phase_ >= (block_type_ ? 8063 : 3223)) {
				pulse.length = (distance_into_phase_ & 1) ? Time(667, 3'500'000) : Time(735, 3'500'000);

				// Check whether this is the last one.
				if(distance_into_phase_ == (block_type_ ? 8064 : 3224)) {
					distance_into_phase_ = 0;
					phase_ = Phase::Data;
				}
			}
		} break;

		case Phase::Data: {
			// Output two pulses of length 855 for a 0; two of length 1710 for a 1,
			// from MSB to LSB.
			pulse.length = (data_byte_ & 0x80) ? Time(1710, 3'500'000) : Time(855, 3'500'000);
			++distance_into_phase_;

			if(!(distance_into_phase_ & 1)) {
				data_byte_ <<= 1;
			}

			if(!(distance_into_phase_ & 15)) {
				if((distance_into_phase_ >> 4) == block_length_) {
					if(block_type_) {
						distance_into_phase_ = 0;
						phase_ = Phase::Gap;
					} else {
						read_next_block();
					}
				} else {
					data_byte_ = file_.get8();
				}
			}
		} break;

		case Phase::Gap:
			Pulse gap;
			gap.type = Pulse::Type::Zero;
			gap.length = Time(1);

			read_next_block();
		return gap;
	}

	return pulse;
}